

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkloader.c
# Opt level: O0

ktxVulkanDeviceInfo *
ktxVulkanDeviceInfo_CreateEx
          (VkInstance instance,VkPhysicalDevice physicalDevice,VkDevice device,VkQueue queue,
          VkCommandPool cmdPool,VkAllocationCallbacks *pAllocator,ktxVulkanFunctions *pFuncs)

{
  ktx_error_code_e kVar1;
  ktxVulkanDeviceInfo *newvdi;
  VkCommandPool in_stack_000000d0;
  VkQueue in_stack_000000d8;
  VkDevice in_stack_000000e0;
  VkPhysicalDevice in_stack_000000e8;
  VkInstance in_stack_000000f0;
  ktxVulkanDeviceInfo *in_stack_000000f8;
  VkAllocationCallbacks *in_stack_00000110;
  ktxVulkanFunctions *in_stack_00000118;
  ktxVulkanDeviceInfo *local_38;
  
  local_38 = (ktxVulkanDeviceInfo *)malloc(0x330);
  if ((local_38 != (ktxVulkanDeviceInfo *)0x0) &&
     (kVar1 = ktxVulkanDeviceInfo_ConstructEx
                        (in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,
                         in_stack_000000d8,in_stack_000000d0,in_stack_00000110,in_stack_00000118),
     kVar1 != KTX_SUCCESS)) {
    free(local_38);
    local_38 = (ktxVulkanDeviceInfo *)0x0;
  }
  return local_38;
}

Assistant:

ktxVulkanDeviceInfo*
ktxVulkanDeviceInfo_CreateEx(VkInstance instance,
                             VkPhysicalDevice physicalDevice, VkDevice device,
                             VkQueue queue, VkCommandPool cmdPool,
                             const VkAllocationCallbacks* pAllocator,
                             const ktxVulkanFunctions* pFuncs)
{
    ktxVulkanDeviceInfo* newvdi;
    newvdi = (ktxVulkanDeviceInfo*)malloc(sizeof(ktxVulkanDeviceInfo));
    if (newvdi != NULL) {
        if (ktxVulkanDeviceInfo_ConstructEx(newvdi, instance, physicalDevice,
                                            device, queue, cmdPool, pAllocator,
                                            pFuncs) != KTX_SUCCESS)
        {
            free(newvdi);
            newvdi = 0;
        }
    }
    return newvdi;
}